

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThread.cpp
# Opt level: O3

void __thiscall IlmThread_2_5::Thread::~Thread(Thread *this)

{
  this->_vptr_Thread = (_func_int **)&PTR__Thread_003cd298;
  if ((this->_thread)._M_id._M_thread != 0) {
    std::thread::join();
    if ((this->_thread)._M_id._M_thread != 0) {
      std::terminate();
    }
  }
  return;
}

Assistant:

Thread::~Thread ()
{
    // hopefully the thread has basically exited and we are just
    // cleaning up, because run is a virtual function, so the v-table
    // has already been partly destroyed...
    if ( _thread.joinable () )
        _thread.join ();
}